

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderFragDataTests.cpp
# Opt level: O1

bool deqp::gles3::Functional::anon_unknown_0::compareSingleColor
               (TestLog *log,Surface *surface,RGBA expectedColor,RGBA threshold)

{
  ostringstream *poVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  void *__buf;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int local_21c;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Expecting ",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
  poVar6 = (ostream *)std::ostream::operator<<(poVar1,expectedColor.m_value & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  uVar12 = expectedColor.m_value >> 8 & 0xff;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  uVar13 = expectedColor.m_value >> 0x10 & 0xff;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,expectedColor.m_value >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," with threshold ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
  poVar6 = (ostream *)std::ostream::operator<<(poVar1,threshold.m_value & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,threshold.m_value >> 8 & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,threshold.m_value >> 0x10 & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,threshold.m_value >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (surface->m_height < 1) {
    local_21c = 0;
  }
  else {
    iVar11 = 0;
    local_21c = 0;
    do {
      iVar5 = surface->m_width;
      if (0 < iVar5) {
        iVar14 = 0;
        do {
          uVar2 = *(uint *)((long)(surface->m_pixels).m_ptr + (long)(iVar5 * iVar11 + iVar14) * 4);
          if (uVar2 != expectedColor.m_value) {
            uVar7 = (uVar2 & 0xff) - (expectedColor.m_value & 0xff);
            uVar3 = -uVar7;
            if (0 < (int)uVar7) {
              uVar3 = uVar7;
            }
            iVar8 = (uVar2 >> 8 & 0xff) - uVar12;
            iVar5 = -iVar8;
            if (0 < iVar8) {
              iVar5 = iVar8;
            }
            iVar9 = (uVar2 >> 0x10 & 0xff) - uVar13;
            iVar8 = -iVar9;
            if (0 < iVar9) {
              iVar8 = iVar9;
            }
            iVar10 = (uVar2 >> 0x18) - (expectedColor.m_value >> 0x18);
            iVar9 = -iVar10;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            local_1b0._0_4_ = iVar8 << 0x10 | iVar5 << 8 | iVar9 << 0x18 | uVar3;
            bVar4 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,threshold);
            if (!bVar4) {
              if (local_21c < 10) {
                local_1b0._0_8_ = log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1b0 + 8),"ERROR: Got ",0xb);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1b0 + 8),"RGBA(",5);
                poVar6 = (ostream *)std::ostream::operator<<(local_1b0 + 8,uVar2 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar2 >> 8 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar2 >> 0x10 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar2 >> 0x18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1b0 + 8)," at (",5);
                std::ostream::operator<<(local_1b0 + 8,iVar14);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1b0 + 8),", ",2);
                std::ostream::operator<<(local_1b0 + 8,iVar11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1b0 + 8),")!",2);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
                std::ios_base::~ios_base(local_138);
              }
              else if (local_21c == 10) {
                local_1b0._0_8_ = log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1b0 + 8),"...",3);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
                std::ios_base::~ios_base(local_138);
              }
              local_21c = local_21c + 1;
            }
          }
          iVar14 = iVar14 + 1;
          iVar5 = surface->m_width;
        } while (iVar14 < iVar5);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < surface->m_height);
  }
  if (local_21c < 1) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Image comparison passed.",0x18);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Found ",6);
    std::ostream::operator<<(poVar1,local_21c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," invalid pixels, comparison FAILED!",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"ResultImage","");
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Result Image","");
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_1d0,&local_1f0,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,(int)log,__buf,(size_t)surface);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  return local_21c < 1;
}

Assistant:

static bool compareSingleColor (tcu::TestLog& log, const tcu::Surface& surface, tcu::RGBA expectedColor, tcu::RGBA threshold)
{
	const int	maxPrints			= 10;
	int			numFailedPixels		= 0;

	log << TestLog::Message << "Expecting " << expectedColor << " with threshold " << threshold << TestLog::EndMessage;

	for (int y = 0; y < surface.getHeight(); y++)
	{
		for (int x = 0; x < surface.getWidth(); x++)
		{
			const tcu::RGBA		resultColor		= surface.getPixel(x, y);
			const bool			isOk			= compareThreshold(resultColor, expectedColor, threshold);

			if (!isOk)
			{
				if (numFailedPixels < maxPrints)
					log << TestLog::Message << "ERROR: Got " << resultColor << " at (" << x << ", " << y << ")!" << TestLog::EndMessage;
				else if (numFailedPixels == maxPrints)
					log << TestLog::Message << "..." << TestLog::EndMessage;

				numFailedPixels += 1;
			}
		}
	}

	if (numFailedPixels > 0)
	{
		log << TestLog::Message << "Found " << numFailedPixels << " invalid pixels, comparison FAILED!" << TestLog::EndMessage;
		log << TestLog::Image("ResultImage", "Result Image", surface);
		return false;
	}
	else
	{
		log << TestLog::Message << "Image comparison passed." << TestLog::EndMessage;
		return true;
	}
}